

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__socket_sockopt(uv_handle_t *handle,int optname,int *value)

{
  uv_handle_type uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  socklen_t len;
  
  if (value == (int *)0x0 || handle == (uv_handle_t *)0x0) {
    return -0x16;
  }
  uVar1 = handle->type;
  lVar4 = 0xb8;
  if ((uVar1 != UV_NAMED_PIPE) && (uVar1 != UV_TCP)) {
    if (uVar1 != UV_UDP) {
      return -0x5f;
    }
    lVar4 = 0xb0;
  }
  iVar2 = *(int *)((long)handle->handle_queue + lVar4 + -0x20);
  if (*value == 0) {
    iVar2 = getsockopt(iVar2,1,optname,value,&len);
  }
  else {
    iVar2 = setsockopt(iVar2,1,optname,value,4);
  }
  iVar3 = 0;
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    iVar3 = -*piVar5;
  }
  return iVar3;
}

Assistant:

int uv__socket_sockopt(uv_handle_t* handle, int optname, int* value) {
  int r;
  int fd;
  socklen_t len;

  if (handle == NULL || value == NULL)
    return UV_EINVAL;

  if (handle->type == UV_TCP || handle->type == UV_NAMED_PIPE)
    fd = uv__stream_fd((uv_stream_t*) handle);
  else if (handle->type == UV_UDP)
    fd = ((uv_udp_t *) handle)->io_watcher.fd;
  else
    return UV_ENOTSUP;

  len = sizeof(*value);

  if (*value == 0)
    r = getsockopt(fd, SOL_SOCKET, optname, value, &len);
  else
    r = setsockopt(fd, SOL_SOCKET, optname, (const void*) value, len);

  if (r < 0)
    return UV__ERR(errno);

  return 0;
}